

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

bool __thiscall
InstanceIsLessThanComparator::operator()
          (InstanceIsLessThanComparator *this,shared_ptr<Instance> *lhs,shared_ptr<Instance> *rhs)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  Context *this_00;
  BooleanInstance *pBVar9;
  CharacterInstance *pCVar10;
  FloatInstance *pFVar11;
  IntegerInstance *pIVar12;
  undefined8 *puVar13;
  float fVar14;
  float fVar15;
  float eps;
  string rhs_type;
  string lhs_type;
  StringInstance *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  string local_b8 [32];
  string local_98 [36];
  undefined4 local_74;
  float local_70;
  string local_60 [32];
  string local_40 [63];
  byte local_1;
  
  std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b374c);
  Instance::type_abi_cxx11_(&in_stack_fffffffffffffee8->super_Instance);
  std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b3769);
  Instance::type_abi_cxx11_(&in_stack_fffffffffffffee8->super_Instance);
  this_00 = Context::get_instance();
  local_70 = Context::get_float_comparison_tolerance(this_00);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffef7,
                                   CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                          (char *)in_stack_fffffffffffffee8);
  if ((bVar1) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffef7,
                                       CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)
                                      ),(char *)in_stack_fffffffffffffee8), bVar1)) {
    pBVar9 = (BooleanInstance *)
             std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
    bVar1 = BooleanInstance::value(pBVar9);
    pBVar9 = (BooleanInstance *)
             std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
    bVar2 = BooleanInstance::value(pBVar9);
    local_1 = bVar1 < bVar2;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                            (char *)in_stack_fffffffffffffee8);
    if ((bVar1) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffef7,
                                          CONCAT16(in_stack_fffffffffffffef6,
                                                   in_stack_fffffffffffffef0)),
                                (char *)in_stack_fffffffffffffee8), bVar1)) {
      pCVar10 = (CharacterInstance *)
                std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
      cVar3 = CharacterInstance::value(pCVar10);
      pCVar10 = (CharacterInstance *)
                std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
      cVar4 = CharacterInstance::value(pCVar10);
      local_1 = cVar3 < cVar4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffef7,
                                       CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)
                                      ),(char *)in_stack_fffffffffffffee8);
      if ((bVar1) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffef7,
                                              CONCAT16(in_stack_fffffffffffffef6,
                                                       in_stack_fffffffffffffef0)),
                                  (char *)in_stack_fffffffffffffee8), bVar1)) {
        pIVar12 = (IntegerInstance *)
                  std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)CONCAT17(in_stack_fffffffffffffef7,
                                        CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0
                                                )));
        iVar8 = IntegerInstance::value(pIVar12);
        pIVar12 = (IntegerInstance *)
                  std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)CONCAT17(in_stack_fffffffffffffef7,
                                        CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0
                                                )));
        iVar7 = IntegerInstance::value(pIVar12);
        local_1 = iVar8 < iVar7;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffef7,
                                          CONCAT16(in_stack_fffffffffffffef6,
                                                   in_stack_fffffffffffffef0)),
                                (char *)in_stack_fffffffffffffee8);
        if ((bVar1) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffef7,
                                                CONCAT16(in_stack_fffffffffffffef6,
                                                         in_stack_fffffffffffffef0)),
                                    (char *)in_stack_fffffffffffffee8), bVar1)) {
          pIVar12 = (IntegerInstance *)
                    std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)CONCAT17(in_stack_fffffffffffffef7,
                                          CONCAT16(in_stack_fffffffffffffef6,
                                                   in_stack_fffffffffffffef0)));
          iVar8 = IntegerInstance::value(pIVar12);
          pFVar11 = (FloatInstance *)
                    std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)CONCAT17(in_stack_fffffffffffffef7,
                                          CONCAT16(in_stack_fffffffffffffef6,
                                                   in_stack_fffffffffffffef0)));
          fVar15 = FloatInstance::value(pFVar11);
          local_1 = (float)iVar8 - fVar15 < -local_70;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffef7,
                                              CONCAT16(in_stack_fffffffffffffef6,
                                                       in_stack_fffffffffffffef0)),
                                  (char *)in_stack_fffffffffffffee8);
          if ((bVar1) &&
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffef7,
                                                  CONCAT16(in_stack_fffffffffffffef6,
                                                           in_stack_fffffffffffffef0)),
                                      (char *)in_stack_fffffffffffffee8), bVar1)) {
            pFVar11 = (FloatInstance *)
                      std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)CONCAT17(in_stack_fffffffffffffef7,
                                            CONCAT16(in_stack_fffffffffffffef6,
                                                     in_stack_fffffffffffffef0)));
            fVar15 = FloatInstance::value(pFVar11);
            pFVar11 = (FloatInstance *)
                      std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)CONCAT17(in_stack_fffffffffffffef7,
                                            CONCAT16(in_stack_fffffffffffffef6,
                                                     in_stack_fffffffffffffef0)));
            fVar14 = FloatInstance::value(pFVar11);
            local_1 = fVar15 - fVar14 < -local_70;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffef7,
                                                CONCAT16(in_stack_fffffffffffffef6,
                                                         in_stack_fffffffffffffef0)),
                                    (char *)in_stack_fffffffffffffee8);
            if ((bVar1) &&
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffef7,
                                                    CONCAT16(in_stack_fffffffffffffef6,
                                                             in_stack_fffffffffffffef0)),
                                        (char *)in_stack_fffffffffffffee8), bVar1)) {
              pFVar11 = (FloatInstance *)
                        std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)CONCAT17(in_stack_fffffffffffffef7,
                                                CONCAT16(in_stack_fffffffffffffef6,
                                                         in_stack_fffffffffffffef0)));
              fVar15 = FloatInstance::value(pFVar11);
              pIVar12 = (IntegerInstance *)
                        std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)CONCAT17(in_stack_fffffffffffffef7,
                                                CONCAT16(in_stack_fffffffffffffef6,
                                                         in_stack_fffffffffffffef0)));
              iVar8 = IntegerInstance::value(pIVar12);
              local_1 = fVar15 - (float)iVar8 < -local_70;
            }
            else {
              uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffef7,
                                                  CONCAT16(in_stack_fffffffffffffef6,
                                                           in_stack_fffffffffffffef0)),
                                      (char *)in_stack_fffffffffffffee8);
              if ((!(bool)uVar5) ||
                 (uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffef6,
                                                                     in_stack_fffffffffffffef0)),
                                          (char *)in_stack_fffffffffffffee8), !(bool)uVar6)) {
                puVar13 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar13 = "RuntimeError: cannot compare these two types.";
                __cxa_throw(puVar13,&char_const*::typeinfo,0);
              }
              std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffffef0)));
              StringInstance::value_abi_cxx11_(in_stack_fffffffffffffee8);
              std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffffef0)));
              StringInstance::value_abi_cxx11_(in_stack_fffffffffffffee8);
              local_1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffffef0)),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffffee8);
              std::__cxx11::string::~string(local_b8);
              std::__cxx11::string::~string(local_98);
            }
          }
        }
      }
    }
  }
  local_74 = 1;
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool InstanceIsLessThanComparator::operator()(const std::shared_ptr<Instance>& lhs,
                                              const std::shared_ptr<Instance>& rhs) const {
    const std::string lhs_type = lhs->type();
    const std::string rhs_type = rhs->type();
    float eps = Context::get_instance()->get_float_comparison_tolerance();
    if (lhs_type == "Boolean" && rhs_type == "Boolean")
        return static_cast<const BooleanInstance&>(*lhs).value() < static_cast<const BooleanInstance&>(*rhs).value();
    if (lhs_type == "Character" && rhs_type == "Character")
        return static_cast<const CharacterInstance&>(*lhs).value() <
               static_cast<const CharacterInstance&>(*rhs).value();
    if (lhs_type == "Integer" && rhs_type == "Integer")
        return static_cast<const IntegerInstance&>(*lhs).value() < static_cast<const IntegerInstance&>(*rhs).value();
    if (lhs_type == "Integer" && rhs_type == "Float")
        return float(static_cast<const IntegerInstance&>(*lhs).value()) -
               static_cast<const FloatInstance&>(*rhs).value() < -eps;
    if (lhs_type == "Float" && rhs_type == "Float")
        return static_cast<const FloatInstance&>(*lhs).value() - static_cast<const FloatInstance&>(*rhs).value() < -eps;
    if (lhs_type == "Float" && rhs_type == "Integer")
        return static_cast<const FloatInstance&>(*lhs).value() -
               float(static_cast<const IntegerInstance&>(*rhs).value()) < -eps;
    if (lhs_type == "String" && rhs_type == "String")
        return static_cast<const StringInstance&>(*lhs).value() < static_cast<const StringInstance&>(*rhs).value();
    throw EXC_INVALID_COMPARISON;
}